

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_nullwindow.c
# Opt level: O2

short SEARCH_nullwindow(chess_state_t *state,search_state_t *search_state,uchar depth,uchar ply,
                       move_t *move,short beta)

{
  int *piVar1;
  byte bVar2;
  move_t mVar3;
  pv_line_t *ppVar4;
  pv_line_t *ppVar5;
  ulong uVar6;
  short sVar7;
  ushort uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint num_moves;
  int64_t iVar12;
  transposition_entry_t *ptVar13;
  char cVar14;
  undefined7 in_register_00000009;
  long lVar15;
  byte depth_00;
  short sVar16;
  uint uVar17;
  uint num_moves_00;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  byte bVar21;
  short local_55c;
  uchar local_544;
  move_t next_move_1;
  ulong local_520;
  int (*local_518) [64] [64];
  move_t (*local_510) [2];
  pv_line_t *local_508;
  move_t *local_500;
  pv_line_t *local_4f8;
  int *local_4f0;
  ulong local_4e8;
  bitboard_t pinned;
  bitboard_t pinners;
  bitboard_t block_check;
  move_t next_move;
  bitboard_t local_450;
  byte local_441;
  char local_440;
  chess_state_t next_state;
  
  *move = 0;
  search_state->pv_table[CONCAT71(in_register_00000009,ply) & 0xffffffff].size = 0;
  iVar9 = search_state->next_clock_check;
  search_state->next_clock_check = iVar9 + -1;
  if (iVar9 < 2) {
    search_state->next_clock_check = 10000;
    iVar12 = CLOCK_time_passed(search_state->start_time_ms);
    if (search_state->time_for_move_ms <= iVar12) {
      search_state->abort_search = 1;
    }
  }
  if (search_state->abort_search != 0) {
    return 0;
  }
  bVar21 = 100;
  if (ply < 100) {
    bVar21 = ply;
  }
  iVar9 = STATE_checkers_and_pinners(state,&block_check,&pinners,&pinned);
  depth_00 = (depth + '\x01') - (iVar9 == 0);
  if (depth_00 == 0) {
    sVar7 = SEARCH_nullwindow_quiescence(state,search_state,beta);
    return sVar7;
  }
  uVar10 = (uint)depth_00;
  ptVar13 = HASHTABLE_transition_retrieve(search_state->hashtable,state->hash);
  if (ptVar13 != (transposition_entry_t *)0x0) {
    mVar3 = ptVar13->best_move;
    *move = mVar3;
    bVar2 = ptVar13->depth;
    if (depth_00 <= bVar2) {
      sVar7 = ptVar13->score;
      if (ptVar13->type == '\x01') {
        if (beta <= sVar7) goto LAB_00104ef3;
        if (sVar7 < -999) {
          sVar7 = sVar7 + ((ushort)bVar2 - (ushort)depth_00);
        }
      }
      else {
        if (sVar7 < beta) goto LAB_00104ef3;
        if (999 < sVar7) {
          sVar7 = sVar7 + ((ushort)depth_00 - (ushort)bVar2);
        }
      }
      if (mVar3 != 0) {
        return sVar7;
      }
      if (state->last_move != 0) {
        return sVar7;
      }
    }
  }
LAB_00104ef3:
  uVar18 = -uVar10 - 1000;
  if ((((4 < depth_00) && (iVar9 == 0)) && (state->last_move != 0)) &&
     (iVar11 = STATE_risk_zugzwang(state), iVar11 == 0)) {
    memcpy(&next_state,state,0x90);
    STATE_apply_move(&next_state,0);
    sVar7 = SEARCH_nullwindow(&next_state,search_state,(depth == '\x05') + depth + 0xfc,bVar21 + 1,
                              &next_move,1 - beta);
    if (beta <= -sVar7) {
      uVar18 = (uint)(ushort)beta;
    }
  }
  sVar7 = (short)uVar18;
  if (sVar7 < beta) {
    num_moves = STATE_generate_moves(state,iVar9,block_check,pinners,pinned,(move_t *)&next_state);
    local_510 = search_state->killer_move + bVar21;
    MOVEORDER_rate_moves
              (state,(move_t *)&next_state,num_moves,*move,*local_510,
               search_state->history_heuristic[state->player]);
    if (iVar9 == 0) {
      local_4e8 = 0;
      if (depth_00 < 4) {
        sVar7 = EVAL_evaluate_board(state);
        local_4e8 = (ulong)CONCAT31((int3)(char)((ushort)beta >> 8),
                                    (int)sVar7 + *(int *)(&DAT_0010a280 + (ulong)depth * 4) <
                                    (int)beta);
      }
    }
    else {
      local_4e8 = 0;
    }
    lVar15 = 0;
    local_518 = search_state->history_heuristic;
    local_4f0 = &search_state->pv_table[(ulong)bVar21 + 1].size;
    local_544 = depth_00 - 1;
    local_55c = 1 - beta;
    local_4f8 = search_state->pv_table + bVar21;
    local_500 = search_state->pv_table[bVar21].moves + 1;
    local_520 = (ulong)(byte)(bVar21 + 1);
    local_508 = search_state->pv_table + local_520;
    uVar19 = 0;
    if (0 < (int)num_moves) {
      uVar19 = (ulong)num_moves;
    }
    local_4e8 = local_4e8 ^ 1;
    num_moves_00 = num_moves;
    for (uVar20 = 0; uVar6 = local_4e8, sVar7 = (short)uVar18, uVar19 != uVar20; uVar20 = uVar20 + 1
        ) {
      MOVEORDER_best_move_first((move_t *)((long)next_state.bitboard + lVar15),num_moves_00);
      mVar3 = *(move_t *)((long)next_state.bitboard + uVar20 * 4);
      memcpy((chess_state_t *)&next_move,state,0x90);
      STATE_apply_move((chess_state_t *)&next_move,mVar3);
      uVar17 = mVar3 & 0x300000;
      if (((uVar20 < 2 || (char)uVar6 != '\0') || (uVar17 != 0)) ||
         (iVar11 = SEARCH_is_check((chess_state_t *)&next_move,(uint)local_441), iVar11 != 0)) {
        HISTORY_push(search_state->history,local_450);
        iVar11 = HISTORY_is_repetition(search_state->history,(int)local_440);
        if ((iVar11 == 0) && (iVar11 = EVAL_draw((chess_state_t *)&next_move), iVar11 == 0)) {
          if (((2 < depth_00) && (3 < uVar20)) && (uVar17 == 0 && iVar9 == 0)) {
            cVar14 = (uVar20 < 0x10 || depth_00 < 5) + -3;
            if (uVar20 < 0xc) {
              cVar14 = -1;
            }
            if (depth_00 < 4) {
              cVar14 = -1;
            }
            uVar8 = SEARCH_nullwindow((chess_state_t *)&next_move,search_state,cVar14 + local_544,
                                      (uchar)local_520,&next_move_1,local_55c);
            uVar17 = -(uint)uVar8;
            if ((short)uVar17 <= sVar7) goto LAB_00105290;
          }
          uVar8 = SEARCH_nullwindow((chess_state_t *)&next_move,search_state,local_544,
                                    (uchar)local_520,&next_move_1,local_55c);
          uVar17 = -(uint)uVar8;
        }
        else {
          *local_4f0 = 0;
          uVar17 = 0;
        }
LAB_00105290:
        HISTORY_pop(search_state->history);
        ppVar5 = local_4f8;
        ppVar4 = local_508;
        sVar16 = (short)uVar17;
        if (sVar7 < sVar16) {
          mVar3 = *(move_t *)((long)next_state.bitboard + uVar20 * 4);
          *move = mVar3;
          local_4f8->moves[0] = mVar3;
          memcpy(local_500,local_508,(long)local_508->size << 2);
          ppVar5->size = ppVar4->size + 1;
          uVar18 = uVar17;
          if (beta <= sVar16) {
            uVar18 = *move;
            sVar7 = sVar16;
            if ((uVar18 & 0x300000) == 0) {
              if (uVar18 != (*local_510)[0]) {
                (*local_510)[1] = (*local_510)[0];
                uVar18 = *move;
                (*local_510)[0] = uVar18;
              }
              piVar1 = (int *)((long)local_518[state->player][0] +
                              (ulong)(uVar18 >> 4 & 0xfc) + (ulong)((uVar18 & 0x3f) << 8));
              *piVar1 = *piVar1 + uVar10 * uVar10;
            }
            break;
          }
        }
      }
      num_moves_00 = num_moves_00 - 1;
      lVar15 = lVar15 + 4;
    }
    if (num_moves == 0 && iVar9 == 0) {
      sVar7 = 0;
    }
  }
  if (search_state->abort_search == 0) {
    HASHTABLE_transition_store
              (search_state->hashtable,state->hash,depth_00,sVar7 < beta,sVar7,*move);
  }
  return sVar7;
}

Assistant:

short SEARCH_nullwindow(const chess_state_t *state, search_state_t *search_state, unsigned char depth, unsigned char ply, move_t *move, short beta)
{
    *move = 0;
    search_state->pv_table[ply].size = 0;

    /* Check if time is up */
    search_state->next_clock_check--;
    if(search_state->next_clock_check <= 0) {
        search_state->next_clock_check = SEARCH_ITERATIONS_BETWEEN_CLOCK_CHECK;
        if(CLOCK_time_passed(search_state->start_time_ms) >= search_state->time_for_move_ms) {
            search_state->abort_search = 1;
        }
    }
    if(search_state->abort_search) {
        return 0;
    }

    if(ply > MAX_SEARCH_DEPTH) ply = MAX_SEARCH_DEPTH;

    /* We will query the transition table soon, time to prefetch */
    HASHTABLE_transition_prefetch(search_state->hashtable, state->hash);

    /* Is playing side in check? */
    bitboard_t block_check, pinners, pinned;
    int num_checkers = STATE_checkers_and_pinners(state, &block_check, &pinners, &pinned);

    /* Check extension */
    if(num_checkers) {
        depth += 1;
    }

    /* Quiescence search */
    if(depth == 0) {
        return SEARCH_nullwindow_quiescence(state, search_state, beta);
    }

    /* Query the transposition table */
    int cutoff = 0;
    short ttable_score = SEARCH_transpositiontable_retrieve(search_state->hashtable, state->hash, depth, beta, move, &cutoff);
    if(cutoff) {
        if(*move || state->last_move) {
            return ttable_score;
        }
    }

    short best_score = SEARCH_MIN_RESULT(depth);

    /* Null move pruning */
    if(depth > 4 && state->last_move && !num_checkers && !STATE_risk_zugzwang(state)) {
        unsigned char R_plus_1 = ((depth > 5) ? 4 : 3);
        chess_state_t next_state = *state;
        STATE_apply_move(&next_state, 0);
        move_t next_move;
        short score = -SEARCH_nullwindow(&next_state, search_state, depth-R_plus_1, ply+1, &next_move, -beta+1);
        if(score >= beta) {
            best_score = beta;
        }
    }

    if(best_score < beta) {
        /* Generate and rate moves */
        move_t moves[256];
        int num_moves = STATE_generate_moves(state, num_checkers, block_check, pinners, pinned, moves);
        MOVEORDER_rate_moves(state, moves, num_moves, *move, search_state->killer_move[ply], search_state->history_heuristic[state->player]);

        /* Check if node is eligible for futility pruning */
        int do_futility_pruning = 0;
        if(depth <= 3 && !num_checkers) {
            const int margin[4] = { 0, 20, 25, 30 };
            if(beta > EVAL_evaluate_board(state) + margin[depth]) {
                do_futility_pruning = 1;
            }
        }

        /* Iterate over all moves */
        for(int i = 0; i < num_moves; i++) {
            /* Pick move with the highest score */
            MOVEORDER_best_move_first(&moves[i], num_moves - i);

            short score = SEARCH_move(state, search_state, depth, ply, moves[i], i, do_futility_pruning, num_checkers, best_score, beta);

            /* Check if score improved by this move */
            if(score > best_score) {
                best_score = score;
                *move = moves[i];

                search_state->pv_table[ply].moves[0] = *move;
                memcpy(&search_state->pv_table[ply].moves[1], search_state->pv_table[ply+1].moves, search_state->pv_table[ply+1].size * sizeof(move_t));
                search_state->pv_table[ply].size = 1 + search_state->pv_table[ply+1].size;

                /* Beta-cuttoff */
                if(best_score >= beta) {
                    if(!MOVE_IS_CAPTURE_OR_PROMOTION(*move)) {
                        /* Killer move */
                        if(*move != search_state->killer_move[ply][0]) {
                            search_state->killer_move[ply][1] = search_state->killer_move[ply][0];
                            search_state->killer_move[ply][0] = *move;
                        }
                        /* History heuristic */
                        search_state->history_heuristic[state->player][MOVE_GET_POS_FROM(*move)][MOVE_GET_POS_TO(*move)] += depth*depth;
                    }
                    break;
                }
            }
        }

        /* Detect checkmate and stalemate */
        if(num_moves == 0) {
            if(num_checkers) {
                /* Checkmate (worst case) */
            } else {
                /* Stalemate */
                best_score = 0;
            }
        }
    }

    /* Store the result in the transposition table */
    if(!search_state->abort_search) {
        SEARCH_transpositiontable_store(search_state->hashtable, state->hash, depth, best_score, *move, beta);
    }

    /* Return score */
    return best_score;
}